

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_cmdline.c
# Opt level: O0

void test_archive_cmdline(void)

{
  archive_cmdline *paVar1;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  archive_cmdline *cl;
  char *in_stack_00000018;
  archive_cmdline *in_stack_00000020;
  void *in_stack_00000030;
  wchar_t in_stack_00000038;
  void *in_stack_ffffffffffffffe8;
  void *pvVar2;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  uint in_stack_fffffffffffffff4;
  
  paVar1 = __archive_cmdline_allocate();
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(wchar_t)((ulong)paVar1 >> 0x20)
                   ,(wchar_t)paVar1,
                   (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
  if (paVar1 != (archive_cmdline *)0x0) {
    __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
    assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                        (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                        (char *)0x123863,in_stack_00000020);
    assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                        (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                        (char *)0x12389a,in_stack_00000020);
    assertion_equal_string
              (in_stack_00000018,cl._4_4_,in_stack_00000008,
               (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
               (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
               in_stack_00000038);
    uVar3 = 0;
    assertion_equal_string
              (in_stack_00000018,cl._4_4_,in_stack_00000008,
               (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
               (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
               in_stack_00000038);
    __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
    pvVar2 = (void *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                        (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x12395a,
                        in_stack_00000020);
    paVar1 = __archive_cmdline_allocate();
    assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                     (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                     (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
    if (paVar1 != (archive_cmdline *)0x0) {
      __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
      assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                          (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x1239d9,
                          in_stack_00000020);
      assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                          (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123a10,
                          in_stack_00000020);
      failure("path should not include a space character");
      assertion_equal_string
                (in_stack_00000018,cl._4_4_,in_stack_00000008,
                 (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                 (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                 in_stack_00000038);
      failure("arg0 should not include a space character");
      uVar3 = 0;
      assertion_equal_string
                (in_stack_00000018,cl._4_4_,in_stack_00000008,
                 (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                 (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                 in_stack_00000038);
      __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
      pvVar2 = (void *)0x0;
      assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                          (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123aec,
                          in_stack_00000020);
      paVar1 = __archive_cmdline_allocate();
      assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                       (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                       (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
      if (paVar1 != (archive_cmdline *)0x0) {
        __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
        assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                            (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123b6b,
                            in_stack_00000020);
        assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                            (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123ba2,
                            in_stack_00000020);
        failure("path should be a full path");
        assertion_equal_string
                  (in_stack_00000018,cl._4_4_,in_stack_00000008,
                   (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                   (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                   in_stack_00000038);
        failure("arg0 should not be a full path");
        uVar3 = 0;
        assertion_equal_string
                  (in_stack_00000018,cl._4_4_,in_stack_00000008,
                   (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                   (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                   in_stack_00000038);
        __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
        pvVar2 = (void *)0x0;
        assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                            (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123c7e,
                            in_stack_00000020);
        paVar1 = __archive_cmdline_allocate();
        assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                         (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                         (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
        if (paVar1 != (archive_cmdline *)0x0) {
          __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
          assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                              (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123cfd,
                              in_stack_00000020);
          assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                              (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123d34,
                              in_stack_00000020);
          failure("path should include a space character");
          assertion_equal_string
                    (in_stack_00000018,cl._4_4_,in_stack_00000008,
                     (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                     (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                     in_stack_00000038);
          failure("arg0 should include a space character");
          uVar3 = 0;
          assertion_equal_string
                    (in_stack_00000018,cl._4_4_,in_stack_00000008,
                     (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                     (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                     in_stack_00000038);
          __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
          pvVar2 = (void *)0x0;
          assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                              (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123e10,
                              in_stack_00000020);
          paVar1 = __archive_cmdline_allocate();
          assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                           (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                           (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
          if (paVar1 != (archive_cmdline *)0x0) {
            __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
            assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123e8f
                                ,in_stack_00000020);
            assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123ec6
                                ,in_stack_00000020);
            failure("path should include a space character");
            assertion_equal_string
                      (in_stack_00000018,cl._4_4_,in_stack_00000008,
                       (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                       (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                       in_stack_00000038);
            failure("arg0 should include a space character");
            uVar3 = 0;
            assertion_equal_string
                      (in_stack_00000018,cl._4_4_,in_stack_00000008,
                       (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                       (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                       in_stack_00000038);
            __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
            pvVar2 = (void *)0x0;
            assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,(char *)0x123fa2
                                ,in_stack_00000020);
            paVar1 = __archive_cmdline_allocate();
            assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                             (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                             (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
            if (paVar1 != (archive_cmdline *)0x0) {
              __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
              assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                  (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                  (char *)0x124021,in_stack_00000020);
              assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                  (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                  (char *)0x124058,in_stack_00000020);
              failure("path should include a space character");
              assertion_equal_string
                        (in_stack_00000018,cl._4_4_,in_stack_00000008,
                         (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                         (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                         in_stack_00000038);
              failure("arg0 should include a space character");
              uVar3 = 0;
              assertion_equal_string
                        (in_stack_00000018,cl._4_4_,in_stack_00000008,
                         (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                         (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                         in_stack_00000038);
              __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
              pvVar2 = (void *)0x0;
              assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                  (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                  (char *)0x124134,in_stack_00000020);
              paVar1 = __archive_cmdline_allocate();
              assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                               (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                               (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
              if (paVar1 != (archive_cmdline *)0x0) {
                __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
                assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                    (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                    (char *)0x1241b3,in_stack_00000020);
                assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                    (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                    (char *)0x1241ea,in_stack_00000020);
                failure("path should include a space character");
                assertion_equal_string
                          (in_stack_00000018,cl._4_4_,in_stack_00000008,
                           (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                           (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                           in_stack_00000038);
                failure("arg0 should include a space character");
                uVar3 = 0;
                assertion_equal_string
                          (in_stack_00000018,cl._4_4_,in_stack_00000008,
                           (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                           (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                           in_stack_00000038);
                __archive_cmdline_free((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3))
                ;
                pvVar2 = (void *)0x0;
                assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                    (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                    (char *)0x1242c6,in_stack_00000020);
                paVar1 = __archive_cmdline_allocate();
                assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                                 (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                                 (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
                if (paVar1 != (archive_cmdline *)0x0) {
                  __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
                  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                      (char *)0x124345,in_stack_00000020);
                  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                      (char *)0x12437c,in_stack_00000020);
                  assertion_equal_string
                            (in_stack_00000018,cl._4_4_,in_stack_00000008,
                             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                             in_stack_00000038);
                  assertion_equal_string
                            (in_stack_00000018,cl._4_4_,in_stack_00000008,
                             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                             in_stack_00000038);
                  uVar3 = 0;
                  assertion_equal_string
                            (in_stack_00000018,cl._4_4_,in_stack_00000008,
                             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                             in_stack_00000038);
                  __archive_cmdline_free
                            ((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
                  pvVar2 = (void *)0x0;
                  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                      (char *)0x124483,in_stack_00000020);
                  paVar1 = __archive_cmdline_allocate();
                  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                                   (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                                   (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),pvVar2);
                  if (paVar1 != (archive_cmdline *)0x0) {
                    __archive_cmdline_parse(in_stack_00000020,in_stack_00000018);
                    assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                        (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                        (char *)0x124502,in_stack_00000020);
                    assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                        (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                        (char *)0x124539,in_stack_00000020);
                    assertion_equal_string
                              (in_stack_00000018,cl._4_4_,in_stack_00000008,
                               (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                               (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                               in_stack_00000038);
                    assertion_equal_string
                              (in_stack_00000018,cl._4_4_,in_stack_00000008,
                               (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                               (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                               in_stack_00000038);
                    assertion_equal_string
                              (in_stack_00000018,cl._4_4_,in_stack_00000008,
                               (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                               (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                               in_stack_00000038);
                    uVar3 = 0;
                    assertion_equal_string
                              (in_stack_00000018,cl._4_4_,in_stack_00000008,
                               (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)paVar1,
                               (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
                               in_stack_00000038);
                    __archive_cmdline_free
                              ((archive_cmdline *)CONCAT44(in_stack_fffffffffffffff4,uVar3));
                    assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)paVar1,
                                        (char *)CONCAT44(in_stack_fffffffffffffff4,uVar3),0,
                                        (char *)0x124687,in_stack_00000020);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_cmdline)
{
	struct archive_cmdline *cl;

	/* Command name only. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip"));
	assertEqualInt(1, cl->argc);
	assertEqualString("gzip", cl->path);
	assertEqualString("gzip", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip "));
	assertEqualInt(1, cl->argc);
	failure("path should not include a space character");
	assertEqualString("gzip", cl->path);
	failure("arg0 should not include a space character");
	assertEqualString("gzip", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl,
	    "/usr/bin/gzip "));
	assertEqualInt(1, cl->argc);
	failure("path should be a full path");
	assertEqualString("/usr/bin/gzip", cl->path);
	failure("arg0 should not be a full path");
	assertEqualString("gzip", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "\"gzip \""));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip ", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip ", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer: pattern 2.*/
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "\"gzip \"x"));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip x", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip x", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer: pattern 3.*/
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl,
	    "\"gzip \"x\" s \""));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip x s ", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip x s ", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer: pattern 4.*/
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl,
	    "\"gzip\\\" \""));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip\" ", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip\" ", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command name with a argument. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip -d"));
	assertEqualInt(2, cl->argc);
	assertEqualString("gzip", cl->path);
	assertEqualString("gzip", cl->argv[0]);
	assertEqualString("-d", cl->argv[1]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command name with two arguments. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip -d -q"));
	assertEqualInt(3, cl->argc);
	assertEqualString("gzip", cl->path);
	assertEqualString("gzip", cl->argv[0]);
	assertEqualString("-d", cl->argv[1]);
	assertEqualString("-q", cl->argv[2]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));
}